

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreFilter.hpp
# Opt level: O2

void __thiscall
cppjieba::PreFilter::PreFilter
          (PreFilter *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *symbols,string *sentence)

{
  bool bVar1;
  Logger local_1a0;
  
  limonp::LocalVector<cppjieba::RuneStr>::LocalVector(&this->sentence_);
  this->symbols_ = symbols;
  bVar1 = DecodeRunesInString(sentence,&this->sentence_);
  if (!bVar1) {
    limonp::Logger::Logger
              (&local_1a0,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/PreFilter.hpp"
               ,0x15);
    std::operator<<((ostream *)&local_1a0,"decode failed. ");
    limonp::Logger::~Logger(&local_1a0);
  }
  this->cursor_ = (this->sentence_).ptr_;
  return;
}

Assistant:

PreFilter(const unordered_set<Rune>& symbols, 
        const string& sentence)
    : symbols_(symbols) {
    if (!DecodeRunesInString(sentence, sentence_)) {
      XLOG(ERROR) << "decode failed. "; 
    }
    cursor_ = sentence_.begin();
  }